

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
container_add_range(container_t *c,uint8_t type,uint32_t min,uint32_t max,uint8_t *result_type)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t bitset_size_bytes;
  int32_t run_size_bytes;
  int32_t nruns_less;
  int32_t nruns_greater;
  run_container_t *run;
  bitset_container_t *bitset_1;
  int32_t union_cardinality_1;
  int32_t nvals_less;
  int32_t nvals_greater;
  array_container_t *array;
  int32_t union_cardinality;
  bitset_container_t *bitset;
  uint8_t *result_type_local;
  uint32_t max_local;
  uint32_t min_local;
  uint8_t type_local;
  container_t *c_local;
  
  c_local = c;
  if (type == '\x01') {
    iVar2 = *c;
    iVar1 = bitset_lenrange_cardinality(*(uint64_t **)((long)c + 8),min,max - min);
    iVar1 = ((max - min) + 1 + iVar2) - iVar1;
    if (iVar1 == 0x10000) {
      *result_type = '\x03';
      c_local = run_container_create_range(0,0x10000);
    }
    else {
      *result_type = '\x01';
      bitset_set_lenrange(*(uint64_t **)((long)c + 8),min,max - min);
      *(int *)c = iVar1;
    }
  }
  else if (type == '\x02') {
    iVar3 = count_greater(*(uint16_t **)((long)c + 8),*c,(uint16_t)max);
    iVar4 = count_less(*(uint16_t **)((long)c + 8),*c - iVar3,(uint16_t)min);
    iVar2 = iVar4 + (max - min) + 1 + iVar3;
    if (iVar2 == 0x10000) {
      *result_type = '\x03';
      c_local = run_container_create_range(0,0x10000);
    }
    else if (iVar2 < 0x1001) {
      *result_type = '\x02';
      array_container_add_range_nvals((array_container_t *)c,min,max,iVar4,iVar3);
    }
    else {
      *result_type = '\x01';
      c_local = bitset_container_from_array((array_container_t *)c);
      bitset_set_lenrange(((bitset_container_t *)c_local)->words,min,max - min);
      ((bitset_container_t *)c_local)->cardinality = iVar2;
    }
  }
  else {
    iVar3 = rle16_count_greater(*(rle16_t **)((long)c + 8),*c,(uint16_t)max);
    iVar4 = rle16_count_less(*(rle16_t **)((long)c + 8),*c - iVar3,(uint16_t)min);
    if ((iVar4 + 1 + iVar3) * 4 < 0x2001) {
      run_container_add_range_nruns((run_container_t *)c,min,max,iVar4,iVar3);
      *result_type = '\x03';
    }
    else {
      c_local = container_from_run_range((run_container_t *)c,min,max,result_type);
    }
  }
  return c_local;
}

Assistant:

static inline container_t *container_add_range(
    container_t *c, uint8_t type,
    uint32_t min, uint32_t max,
    uint8_t *result_type
){
    // NB: when selecting new container type, we perform only inexpensive checks
    switch (type) {
        case BITSET_CONTAINER_TYPE: {
            bitset_container_t *bitset = CAST_bitset(c);

            int32_t union_cardinality = 0;
            union_cardinality += bitset->cardinality;
            union_cardinality += max - min + 1;
            union_cardinality -= bitset_lenrange_cardinality(bitset->words,
                                                             min, max-min);

            if (union_cardinality == INT32_C(0x10000)) {
                *result_type = RUN_CONTAINER_TYPE;
                return run_container_create_range(0, INT32_C(0x10000));
            } else {
                *result_type = BITSET_CONTAINER_TYPE;
                bitset_set_lenrange(bitset->words, min, max - min);
                bitset->cardinality = union_cardinality;
                return bitset;
            }
        }
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *array = CAST_array(c);

            int32_t nvals_greater = count_greater(array->array, array->cardinality, max);
            int32_t nvals_less = count_less(array->array, array->cardinality - nvals_greater, min);
            int32_t union_cardinality = nvals_less + (max - min + 1) + nvals_greater;

            if (union_cardinality == INT32_C(0x10000)) {
                *result_type = RUN_CONTAINER_TYPE;
                return run_container_create_range(0, INT32_C(0x10000));
            } else if (union_cardinality <= DEFAULT_MAX_SIZE) {
                *result_type = ARRAY_CONTAINER_TYPE;
                array_container_add_range_nvals(array, min, max, nvals_less, nvals_greater);
                return array;
            } else {
                *result_type = BITSET_CONTAINER_TYPE;
                bitset_container_t *bitset = bitset_container_from_array(array);
                bitset_set_lenrange(bitset->words, min, max - min);
                bitset->cardinality = union_cardinality;
                return bitset;
            }
        }
        case RUN_CONTAINER_TYPE: {
            run_container_t *run = CAST_run(c);

            int32_t nruns_greater = rle16_count_greater(run->runs, run->n_runs, max);
            int32_t nruns_less = rle16_count_less(run->runs, run->n_runs - nruns_greater, min);

            int32_t run_size_bytes = (nruns_less + 1 + nruns_greater) * sizeof(rle16_t);
            int32_t bitset_size_bytes = BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);

            if (run_size_bytes <= bitset_size_bytes) {
                run_container_add_range_nruns(run, min, max, nruns_less, nruns_greater);
                *result_type = RUN_CONTAINER_TYPE;
                return run;
            } else {
                return container_from_run_range(run, min, max, result_type);
            }
        }
        default:
            __builtin_unreachable();
    }
}